

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O0

unique_ptr<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>_>
 __thiscall
spvtools::
MakeUnique<spvtools::opt::analysis::ArrayConstant,spvtools::opt::analysis::Array_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
          (spvtools *this,Array **args,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *args_1)

{
  ArrayConstant *this_00;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *args_local_1;
  Array **args_local;
  
  this_00 = (ArrayConstant *)operator_new(0x28);
  opt::analysis::ArrayConstant::ArrayConstant(this_00,*args,args_1);
  std::
  unique_ptr<spvtools::opt::analysis::ArrayConstant,std::default_delete<spvtools::opt::analysis::ArrayConstant>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::ArrayConstant>,void>
            ((unique_ptr<spvtools::opt::analysis::ArrayConstant,std::default_delete<spvtools::opt::analysis::ArrayConstant>>
              *)this,this_00);
  return (__uniq_ptr_data<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}